

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyRwr.c
# Opt level: O2

uint Ivy_NodeGetTruth_rec(Ivy_Obj_t *pObj,int *pNums,int nNums)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar5 = 0;
  if (0 < nNums) {
    uVar6 = (ulong)(uint)nNums;
  }
  while (uVar6 != uVar5) {
    uVar1 = uVar5 + 1;
    piVar2 = pNums + uVar5;
    uVar5 = uVar1;
    if (pObj->Id == *piVar2) {
      return *(uint *)(&UNK_00811c9c + uVar1 * 4);
    }
  }
  if (2 < (*(uint *)&pObj->field_0x8 & 0xf) - 5) {
    __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyRwr.c"
                  ,0x140,"unsigned int Ivy_NodeGetTruth_rec(Ivy_Obj_t *, int *, int)");
  }
  uVar3 = Ivy_NodeGetTruth_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pNums,nNums)
  ;
  uVar3 = -(*(uint *)&pObj->pFanin0 & 1) ^ uVar3;
  if ((*(uint *)&pObj->field_0x8 & 0xf) == 7) {
    return uVar3;
  }
  uVar4 = Ivy_NodeGetTruth_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pNums,nNums)
  ;
  return uVar3 & (-(*(uint *)&pObj->pFanin1 & 1) ^ uVar4);
}

Assistant:

unsigned Ivy_NodeGetTruth_rec( Ivy_Obj_t * pObj, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( pObj->Id == pNums[i] )
            return uMasks[i];
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    uTruth0 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin0(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    uTruth1 = Ivy_NodeGetTruth_rec( Ivy_ObjFanin1(pObj), pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}